

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O3

int X509_VERIFY_PARAM_set1_email(X509_VERIFY_PARAM *param,char *email,size_t emaillen)

{
  int iVar1;
  void *pvVar2;
  
  if (((emaillen == 0) || (pvVar2 = memchr(email,0,emaillen), pvVar2 == (void *)0x0)) &&
     (iVar1 = int_x509_param_set1(&param->email,&param->emaillen,email,emaillen), iVar1 != 0)) {
    return 1;
  }
  param->poison = '\x01';
  return 0;
}

Assistant:

int X509_VERIFY_PARAM_set1_email(X509_VERIFY_PARAM *param, const char *email,
                                 size_t emaillen) {
  if (OPENSSL_memchr(email, '\0', emaillen) != NULL ||
      !int_x509_param_set1(&param->email, &param->emaillen, email, emaillen)) {
    param->poison = 1;
    return 0;
  }

  return 1;
}